

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O1

bool P_CheckForGLNodes(void)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  line_t_conflict **pplVar5;
  bool bVar6;
  
  if (0 < (long)numsubsectors) {
    bVar1 = false;
    lVar3 = 0;
    do {
      uVar4 = (ulong)subsectors[lVar3].numlines;
      if ((subsectors[lVar3].firstline)->v1 == subsectors[lVar3].firstline[uVar4 - 1].v2) {
        bVar6 = subsectors[lVar3].numlines == 0;
        pplVar5 = &segs->linedef;
        if (!bVar6) {
          do {
            if (*pplVar5 == (line_t_conflict *)0x0) {
              bVar1 = true;
              bVar6 = false;
              goto LAB_003f87b3;
            }
            pplVar5 = pplVar5 + 6;
            uVar2 = (int)uVar4 - 1;
            uVar4 = (ulong)uVar2;
          } while (uVar2 != 0);
          bVar6 = true;
        }
      }
      else {
        bVar6 = false;
        bVar1 = false;
      }
LAB_003f87b3:
      if (!bVar6) {
        return bVar1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != numsubsectors);
  }
  uVar2 = CheckForMissingSegs();
  if (0 < (int)uVar2) {
    Printf("%d missing segs counted\nThe BSP needs to be rebuilt.\n",(ulong)uVar2);
  }
  return uVar2 == 0;
}

Assistant:

bool P_CheckForGLNodes()
{
	int i;

	for(i=0;i<numsubsectors;i++)
	{
		subsector_t * sub = &subsectors[i];
		seg_t * firstseg = sub->firstline;
		seg_t * lastseg = sub->firstline + sub->numlines - 1;

		if (firstseg->v1 != lastseg->v2)
		{
			// This subsector is incomplete which means that these
			// are normal nodes
			return false;
		}
		else
		{
			for(DWORD j=0;j<sub->numlines;j++)
			{
				if (segs[j].linedef==NULL)	// miniseg
				{
					// We already have GL nodes. Great!
					return true;
				}
			}
		}
	}
	// all subsectors were closed but there are no minisegs
	// Although unlikely this can happen. Such nodes are not a problem.
	// all that is left is to check whether the BSP covers all sidedefs completely.
	int missing = CheckForMissingSegs();
	if (missing > 0)
	{
		Printf("%d missing segs counted\nThe BSP needs to be rebuilt.\n", missing);
	}
	return missing == 0;
}